

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O3

Ref __thiscall
wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::
ExpressionProcessor::visitStore(wasm::Store__(void *this,Store *curr)

{
  uint8_t uVar1;
  long *plVar2;
  ulong uVar3;
  IString result;
  IString result_00;
  Name name;
  undefined7 uVar4;
  int iVar5;
  Ref RVar6;
  Ref RVar7;
  Ref obj;
  size_t *psVar8;
  Value *this_00;
  Ref *pRVar9;
  long lVar10;
  char *pcVar11;
  void *pvVar12;
  pointer ppCVar13;
  Store *pSVar14;
  Ref in_R8;
  bool bVar15;
  byte bVar16;
  IString nextResult;
  IString key;
  IString op;
  IString possible;
  IString possible_00;
  Name name_00;
  undefined1 local_270 [8];
  Store fakeStore;
  FindAll<wasm::MemoryGrow> local_e8;
  undefined1 local_d0 [8];
  ScopedTemp ptr;
  undefined1 local_a0 [8];
  ScopedTemp value;
  void *local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  FindAll<wasm::CallIndirect> local_60;
  char *local_48;
  char *pcStack_40;
  
  bVar16 = 0;
  plVar2 = *(long **)(*(long *)((long)this + 0x20) + 0x78);
  if (((plVar2 != *(long **)(*(long *)((long)this + 0x20) + 0x80)) &&
      (lVar10 = *plVar2, *(ulong *)(lVar10 + 0x38) < *(ulong *)(lVar10 + 0x40))) &&
     ((curr->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id != 1)) {
    FindAll<wasm::Call>::FindAll((FindAll<wasm::Call> *)local_270,curr->ptr);
    bVar15 = true;
    if (local_270 ==
        (undefined1  [8])
        fakeStore.super_SpecificExpression<(wasm::Expression::Id)13>.super_Expression._0_8_) {
      FindAll<wasm::Call>::FindAll((FindAll<wasm::Call> *)local_d0,curr->value);
      if (local_d0 == (undefined1  [8])ptr.parent) {
        FindAll<wasm::CallIndirect>::FindAll((FindAll<wasm::CallIndirect> *)local_a0,curr->ptr);
        if (local_a0 == (undefined1  [8])value.parent) {
          FindAll<wasm::CallIndirect>::FindAll(&local_60,curr->value);
          ppCVar13 = (pointer)CONCAT71(local_60.list.
                                       super__Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                       local_60.list.
                                       super__Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_1_);
          if (ppCVar13 ==
              local_60.list.
              super__Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            FindAll<wasm::MemoryGrow>::FindAll
                      ((FindAll<wasm::MemoryGrow> *)&value.needFree,curr->ptr);
            pvVar12 = (void *)CONCAT71(value._33_7_,value.needFree);
            if (pvVar12 == local_70) {
              FindAll<wasm::MemoryGrow>::FindAll(&local_e8,curr->value);
              bVar15 = local_e8.list.
                       super__Vector_base<wasm::MemoryGrow_*,_std::allocator<wasm::MemoryGrow_*>_>.
                       _M_impl.super__Vector_impl_data._M_start !=
                       local_e8.list.
                       super__Vector_base<wasm::MemoryGrow_*,_std::allocator<wasm::MemoryGrow_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              if (local_e8.list.
                  super__Vector_base<wasm::MemoryGrow_*,_std::allocator<wasm::MemoryGrow_*>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_e8.list.
                                super__Vector_base<wasm::MemoryGrow_*,_std::allocator<wasm::MemoryGrow_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_e8.list.
                                      super__Vector_base<wasm::MemoryGrow_*,_std::allocator<wasm::MemoryGrow_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_e8.list.
                                      super__Vector_base<wasm::MemoryGrow_*,_std::allocator<wasm::MemoryGrow_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              pvVar12 = (void *)CONCAT71(value._33_7_,value.needFree);
            }
            if (pvVar12 != (void *)0x0) {
              operator_delete(pvVar12,CONCAT44(uStack_64,local_68) - (long)pvVar12);
            }
            ppCVar13 = (pointer)CONCAT71(local_60.list.
                                         super__Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                         local_60.list.
                                         super__Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_1_);
          }
          if (ppCVar13 != (pointer)0x0) {
            operator_delete(ppCVar13,CONCAT44(local_60.list.
                                              super__Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                              _4_4_,(Index)local_60.list.
                                                                                                                      
                                                  super__Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             ) - (long)ppCVar13);
          }
        }
        if (local_a0 != (undefined1  [8])0x0) {
          operator_delete((void *)local_a0,value.type.id - (long)local_a0);
        }
      }
      if (local_d0 != (undefined1  [8])0x0) {
        operator_delete((void *)local_d0,ptr.type.id - (long)local_d0);
      }
    }
    if (local_270 != (undefined1  [8])0x0) {
      operator_delete((void *)local_270,
                      fakeStore.super_SpecificExpression<(wasm::Expression::Id)13>.super_Expression.
                      type.id - (long)local_270);
    }
    if (bVar15) {
      possible.str._M_str = DAT_010b10a8;
      possible.str._M_len = NO_RESULT;
      ScopedTemp::ScopedTemp(wasm::Type,wasm::Wasm2JSBuilder*,wasm::Function*,wasm::IString_
                (local_d0,(Type)0x2,*this,*(Function **)((long)this + 0x18),possible);
      result.str._M_str = (char *)ptr.temp.str._M_len;
      result.str._M_len = ptr.type.id;
      local_48 = (char *)ptr.temp.str._M_len;
      RVar6 = visitAndAssign(wasm::Expression*,wasm::IString_(this,curr->ptr,result);
      ptr._32_8_ = ptr.type.id;
      possible_00.str._M_str = DAT_010b10a8;
      possible_00.str._M_len = NO_RESULT;
      ScopedTemp::ScopedTemp(wasm::Type,wasm::Wasm2JSBuilder*,wasm::Function*,wasm::IString_
                (local_a0,(Type)(curr->value->type).id,*this,*(Function **)((long)this + 0x18),
                 possible_00);
      name.super_IString.str._M_str = (char *)value.temp.str._M_len;
      name.super_IString.str._M_len = value.type.id;
      result_00.str._M_str = (char *)value.temp.str._M_len;
      result_00.str._M_len = value.type.id;
      RVar7 = visitAndAssign(wasm::Expression*,wasm::IString_(this,curr->value,result_00);
      if (RVar6.inst != (Value *)0x0) {
        RVar7 = cashew::ValueBuilder::makeSeq(RVar6,RVar7);
      }
      local_60.list.super__Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>.
      _M_impl.super__Vector_impl_data._M_start._0_1_ = 8;
      name_00.super_IString.str._M_str = local_48;
      name_00.super_IString.str._M_len = ptr._32_8_;
      local_60.list.super__Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           Function::getLocalIndex(*(Function **)((long)this + 0x18),name_00);
      local_60.list.super__Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
      value.needFree = true;
      Function::getLocalIndex(*(Function **)((long)this + 0x18),name);
      fakeStore.ptr = (Expression *)&value.needFree;
      pSVar14 = (Store *)local_270;
      for (lVar10 = 0xb; lVar10 != 0; lVar10 = lVar10 + -1) {
        uVar4 = *(undefined7 *)
                 &(curr->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.
                  field_0x1;
        (pSVar14->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id =
             (curr->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id;
        *(undefined7 *)
         &(pSVar14->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.field_0x1 =
             uVar4;
        curr = (Store *)((long)curr + (ulong)bVar16 * -0x10 + 8);
        pSVar14 = (Store *)((long)pSVar14 + (ulong)bVar16 * -0x10 + 8);
      }
      fakeStore._40_8_ = &local_60;
      RVar6 = Store__(this,(Store *)local_270);
      if (RVar7.inst != (Value *)0x0) {
        RVar6 = cashew::ValueBuilder::makeSeq(RVar7,RVar6);
      }
      processExpression::ExpressionProcessor::ScopedTemp::~ScopedTemp((ScopedTemp *)local_a0);
      processExpression::ExpressionProcessor::ScopedTemp::~ScopedTemp((ScopedTemp *)local_d0);
      return (Ref)RVar6.inst;
    }
  }
  uVar3 = (curr->align).addr;
  if ((uVar3 != 0) && (uVar3 != curr->bytes)) {
    __assert_fail("curr->align == 0 || curr->align == curr->bytes",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                  ,0x5f8,
                  "Ref wasm::Wasm2JSBuilder::processExpression(Expression *, Module *, Function *, bool)::ExpressionProcessor::visitStore(Store *)"
                 );
  }
  RVar6 = makePointer(wasm::Expression*,wasm::Address_(this,curr->ptr,(Address)(curr->offset).addr);
  nextResult.str._M_str = DAT_010b10b8;
  nextResult.str._M_len = EXPRESSION_RESULT;
  pcVar11 = DAT_010b10b8;
  RVar7 = visit(wasm::Expression*,wasm::IString_(this,curr->value,nextResult);
  uVar3 = (curr->valueType).id;
  if (6 < uVar3) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x1c4,"BasicType wasm::Type::getBasic() const");
  }
  iVar5 = (int)uVar3;
  if (iVar5 == 5) {
    local_48 = (char *)cashew::HEAPF64;
    pcStack_40 = DAT_010b1640;
    pvVar12 = (void *)0x18;
    obj.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
    (obj.inst)->type = Null;
    cashew::Value::free(obj.inst,pvVar12);
    (obj.inst)->type = String;
    ((obj.inst)->field_1).str.str._M_len = (size_t)local_48;
    ((obj.inst)->field_1).str.str._M_str = pcStack_40;
    iVar5 = 3;
  }
  else {
    if (iVar5 == 4) {
      psVar8 = &cashew::HEAPF32;
    }
    else {
      if (iVar5 != 2) {
        Fatal::Fatal((Fatal *)local_270);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)
                   &fakeStore.super_SpecificExpression<(wasm::Expression::Id)13>.super_Expression.
                    type,"Unhandled type in store: ",0x19);
        Fatal::operator<<((Fatal *)local_270,&curr->valueType);
        Fatal::~Fatal((Fatal *)local_270);
      }
      uVar1 = curr->bytes;
      if (uVar1 != '\x04') {
        if (uVar1 == '\x02') {
          local_48 = (char *)cashew::HEAP16;
          pcStack_40 = DAT_010b15e0;
          pvVar12 = (void *)0x18;
          obj.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
          (obj.inst)->type = Null;
          cashew::Value::free(obj.inst,pvVar12);
          (obj.inst)->type = String;
          ((obj.inst)->field_1).str.str._M_len = (size_t)local_48;
          ((obj.inst)->field_1).str.str._M_str = pcStack_40;
          iVar5 = 1;
        }
        else {
          if (uVar1 != '\x01') {
            abort();
          }
          local_48 = (char *)cashew::HEAP8;
          pcStack_40 = DAT_010b15d0;
          pvVar12 = (void *)0x18;
          obj.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
          (obj.inst)->type = Null;
          cashew::Value::free(obj.inst,pvVar12);
          (obj.inst)->type = String;
          ((obj.inst)->field_1).str.str._M_len = (size_t)local_48;
          ((obj.inst)->field_1).str.str._M_str = pcStack_40;
          iVar5 = 0;
        }
        goto LAB_00d04433;
      }
      psVar8 = &cashew::HEAP32;
    }
    local_48 = (char *)*psVar8;
    pcStack_40 = (char *)psVar8[1];
    pvVar12 = (void *)0x18;
    obj.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
    (obj.inst)->type = Null;
    cashew::Value::free(obj.inst,pvVar12);
    (obj.inst)->type = String;
    ((obj.inst)->field_1).str.str._M_len = (size_t)local_48;
    ((obj.inst)->field_1).str.str._M_str = pcStack_40;
    iVar5 = 2;
  }
LAB_00d04433:
  RVar6 = cashew::ValueBuilder::makePtrShift(RVar6,iVar5);
  local_270 = (undefined1  [8])cashew::ValueBuilder::makeSub(obj,RVar6);
  if (curr->isAtomic == true) {
    local_48 = (char *)cashew::ATOMICS;
    pcStack_40 = DAT_010b1780;
    pvVar12 = (void *)0x18;
    this_00 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
    this_00->type = Null;
    cashew::Value::free(this_00,pvVar12);
    this_00->type = String;
    (this_00->field_1).str.str._M_len = (size_t)local_48;
    (this_00->field_1).str.str._M_str = pcStack_40;
    key.str._M_str = pcVar11;
    key.str._M_len = DAT_010b17b0;
    RVar6 = cashew::ValueBuilder::makeDot((ValueBuilder *)this_00,cashew::STORE,key);
    RVar6 = cashew::ValueBuilder::makeCall(RVar6);
    pRVar9 = cashew::Ref::operator[]((Ref *)local_270,1);
    cashew::ValueBuilder::appendToCall(RVar6,pRVar9->inst);
    pRVar9 = cashew::Ref::operator[]((Ref *)local_270,2);
    cashew::ValueBuilder::appendToCall(RVar6,pRVar9->inst);
    cashew::ValueBuilder::appendToCall(RVar6,RVar7);
  }
  else {
    op.str._M_str = (char *)RVar7.inst;
    op.str._M_len = DAT_010b1770;
    RVar6 = cashew::ValueBuilder::makeBinary((ValueBuilder *)local_270,cashew::SET,op,in_R8);
  }
  return (Ref)RVar6.inst;
}

Assistant:

Ref visitStore(Store* curr) {
      if (!module->memories.empty() &&
          module->memories[0]->initial < module->memories[0]->max &&
          curr->type != Type::unreachable) {
        // In JS, if memory grows then it is dangerous to write
        //  HEAP[f()] = ..
        // or
        //  HEAP[..] = f()
        // since if the call swaps HEAP (in a growth operation) then
        // we will not actually write to the new version (since the
        // semantics of JS mean we already looked at HEAP and have
        // decided where to assign to).
        if (!FindAll<Call>(curr->ptr).list.empty() ||
            !FindAll<Call>(curr->value).list.empty() ||
            !FindAll<CallIndirect>(curr->ptr).list.empty() ||
            !FindAll<CallIndirect>(curr->value).list.empty() ||
            !FindAll<MemoryGrow>(curr->ptr).list.empty() ||
            !FindAll<MemoryGrow>(curr->value).list.empty()) {
          Ref ret;
          ScopedTemp ptr(Type::i32, parent, func);
          sequenceAppend(ret, visitAndAssign(curr->ptr, ptr));
          ScopedTemp value(curr->value->type, parent, func);
          sequenceAppend(ret, visitAndAssign(curr->value, value));
          LocalGet getPtr;
          getPtr.index = func->getLocalIndex(ptr.getName());
          getPtr.type = Type::i32;
          LocalGet getValue;
          getValue.index = func->getLocalIndex(value.getName());
          getValue.type = curr->value->type;
          Store fakeStore = *curr;
          fakeStore.ptr = &getPtr;
          fakeStore.value = &getValue;
          sequenceAppend(ret, visitStore(&fakeStore));
          return ret;
        }
      }
      // FIXME if memory growth, store ptr cannot contain a function call
      //       also other stores to memory, check them, all makeSub's
      // Unaligned loads and stores must have been fixed up already.
      assert(curr->align == 0 || curr->align == curr->bytes);
      // normal store
      Ref ptr = makePointer(curr->ptr, curr->offset);
      Ref value = visit(curr->value, EXPRESSION_RESULT);
      Ref ret;
      switch (curr->valueType.getBasic()) {
        case Type::i32: {
          switch (curr->bytes) {
            case 1:
              ret = ValueBuilder::makeSub(ValueBuilder::makeName(HEAP8),
                                          ValueBuilder::makePtrShift(ptr, 0));
              break;
            case 2:
              ret = ValueBuilder::makeSub(ValueBuilder::makeName(HEAP16),
                                          ValueBuilder::makePtrShift(ptr, 1));
              break;
            case 4:
              ret = ValueBuilder::makeSub(ValueBuilder::makeName(HEAP32),
                                          ValueBuilder::makePtrShift(ptr, 2));
              break;
            default:
              abort();
          }
          break;
        }
        case Type::f32:
          ret = ValueBuilder::makeSub(ValueBuilder::makeName(HEAPF32),
                                      ValueBuilder::makePtrShift(ptr, 2));
          break;
        case Type::f64:
          ret = ValueBuilder::makeSub(ValueBuilder::makeName(HEAPF64),
                                      ValueBuilder::makePtrShift(ptr, 3));
          break;
        default: {
          Fatal() << "Unhandled type in store: " << curr->valueType;
        }
      }
      if (curr->isAtomic) {
        Ref call = ValueBuilder::makeCall(
          ValueBuilder::makeDot(ValueBuilder::makeName(ATOMICS), STORE));
        ValueBuilder::appendToCall(call, ret[1]);
        ValueBuilder::appendToCall(call, ret[2]);
        ValueBuilder::appendToCall(call, value);
        return call;
      }
      return ValueBuilder::makeBinary(ret, SET, value);
    }